

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring.hxx
# Opt level: O1

void __thiscall Ring<double>::next(Ring<double> *this,double d)

{
  double *pdVar1;
  int iVar2;
  long lVar3;
  
  if ((this->ringDelayedAdd != 0.0) || (NAN(this->ringDelayedAdd))) {
    iVar2 = this->ringSize;
    if (0 < (long)iVar2) {
      pdVar1 = this->ringData;
      lVar3 = 0;
      do {
        pdVar1[lVar3] = this->ringDelayedAdd + pdVar1[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar2 != lVar3);
    }
    this->ringDelayedAdd = 0.0;
  }
  this->ringCacheInvalid = true;
  iVar2 = this->ringCurrentIndex + 1;
  this->ringCurrentIndex = iVar2;
  if (this->ringSize <= iVar2) {
    this->ringCurrentIndex = 0;
    this->ringIsInitialised = true;
  }
  this->ringData[this->ringCurrentIndex] = d;
  return;
}

Assistant:

void flush() const {
        if (ringDelayedAdd != 0.0) {
            for(int i=0; i<ringSize; i++) {
                ringData[i] += ringDelayedAdd;
            }
            ringDelayedAdd = 0.0;
        }
    }